

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostinfo.cpp
# Opt level: O2

QHostInfo __thiscall QHostInfoCache::get(QHostInfoCache *this,QString *name,bool *valid)

{
  QHostInfoCacheElement *other;
  long lVar1;
  undefined1 *in_RCX;
  long lVar2;
  long in_FS_OFFSET;
  undefined1 local_38 [16];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_38._0_8_ = &name[3].d.ptr;
  local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QBasicMutex::lock((QBasicMutex *)local_38._0_8_);
  local_38[8] = true;
  *in_RCX = 0;
  other = QCache<QString,_QHostInfoCache::QHostInfoCacheElement>::relink
                    ((QCache<QString,_QHostInfoCache::QHostInfoCacheElement> *)&(name->d).ptr,
                     (QString *)valid);
  if (other == (QHostInfoCacheElement *)0x0) {
    QHostInfo::QHostInfo((QHostInfo *)this,-1);
  }
  else {
    lVar1 = QElapsedTimer::elapsed();
    lVar2 = (long)*(int *)&(name->d).d;
    if (SBORROW8(lVar1,lVar2 * 1000) != lVar1 + lVar2 * -1000 < 0) {
      *in_RCX = 1;
    }
    QHostInfo::QHostInfo((QHostInfo *)this,&other->info);
  }
  QMutexLocker<QMutex>::~QMutexLocker((QMutexLocker<QMutex> *)local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (QHostInfo)(QHostInfoPrivate *)this;
  }
  __stack_chk_fail();
}

Assistant:

QHostInfo QHostInfoCache::get(const QString &name, bool *valid)
{
    QMutexLocker locker(&this->mutex);

    *valid = false;
    if (QHostInfoCacheElement *element = cache.object(name)) {
        if (element->age.elapsed() < max_age*1000)
            *valid = true;
        return element->info;

        // FIXME idea:
        // if too old but not expired, trigger a new lookup
        // to freshen our cache
    }

    return QHostInfo();
}